

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

void xmlCleanupOutputCallbacks(void)

{
  ulong uVar1;
  xmlInputReadCallback *pp_Var2;
  
  if (xmlOutputCallbackInitialized == '\x01') {
    uVar1 = (ulong)(uint)xmlOutputCallbackNr;
    pp_Var2 = &xmlInputCallbackTable[uVar1 + 0xe].readcallback;
    for (; 0 < (int)uVar1; uVar1 = (ulong)((int)uVar1 - 1)) {
      pp_Var2[2] = (xmlInputReadCallback)0x0;
      pp_Var2[3] = (xmlInputReadCallback)0x0;
      *pp_Var2 = (xmlInputReadCallback)0x0;
      pp_Var2[1] = (xmlInputReadCallback)0x0;
      pp_Var2 = pp_Var2 + -4;
    }
    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = '\0';
  }
  return;
}

Assistant:

void
xmlCleanupOutputCallbacks(void)
{
    int i;

    if (!xmlOutputCallbackInitialized)
        return;

    for (i = xmlOutputCallbackNr - 1; i >= 0; i--) {
        xmlOutputCallbackTable[i].matchcallback = NULL;
        xmlOutputCallbackTable[i].opencallback = NULL;
        xmlOutputCallbackTable[i].writecallback = NULL;
        xmlOutputCallbackTable[i].closecallback = NULL;
    }

    xmlOutputCallbackNr = 0;
    xmlOutputCallbackInitialized = 0;
}